

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

void __thiscall bitio::bitio_stream::load_buffer(bitio_stream *this)

{
  size_t sVar1;
  size_t local_28;
  size_t tmp_len;
  bitio_stream *this_local;
  
  sVar1 = fread(this->byte_buffer,1,this->buffer_size,(FILE *)this->file);
  local_28 = sVar1;
  if (sVar1 == 0) {
    local_28 = this->current_buffer_length;
  }
  this->current_buffer_length = local_28;
  this->eof = sVar1 == 0;
  this->byte_index = 0;
  return;
}

Assistant:

inline void bitio_stream::load_buffer() {
    auto tmp_len = fread(byte_buffer, 1, buffer_size, file);
    current_buffer_length = tmp_len != 0 ? tmp_len : current_buffer_length;
    eof = tmp_len == 0;
    byte_index = 0;
}